

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

Error * ot::commissioner::Interpreter::GetJoinerType
                  (Error *__return_storage_ptr__,JoinerType *aType,string *aStr)

{
  string *psVar1;
  bool bVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar3;
  format_args args;
  string_view fmt;
  anon_class_1_0_00000001 local_1ba;
  v10 local_1b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b8;
  char *local_1b0;
  string local_1a8;
  Error local_188;
  allocator local_159;
  string local_158;
  allocator local_131;
  string local_130;
  allocator local_f9;
  string local_f8;
  undefined1 local_d1;
  string *local_d0;
  string *aStr_local;
  JoinerType *aType_local;
  Error *error;
  undefined1 local_a0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  char *local_88;
  string *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  char *pcStack_70;
  string *local_68;
  v10 *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  char *pcStack_40;
  Error **local_38;
  undefined1 *local_30;
  Error **local_28;
  undefined8 local_20;
  undefined1 *local_18;
  Error **local_10;
  
  local_d1 = 0;
  local_d0 = aStr;
  aStr_local = (string *)aType;
  aType_local = &__return_storage_ptr__->mCode;
  Error::Error(__return_storage_ptr__);
  psVar1 = local_d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,"meshcop",&local_f9);
  bVar2 = CaseInsensitiveEqual(psVar1,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  psVar1 = local_d0;
  if (bVar2) {
    *(undefined4 *)aStr_local = 0;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_130,"ae",&local_131);
    bVar2 = CaseInsensitiveEqual(psVar1,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::allocator<char>::~allocator((allocator<char> *)&local_131);
    psVar1 = local_d0;
    if (bVar2) {
      *(undefined4 *)aStr_local = 1;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_158,"nmkp",&local_159);
      bVar2 = CaseInsensitiveEqual(psVar1,&local_158);
      std::__cxx11::string::~string((string *)&local_158);
      std::allocator<char>::~allocator((allocator<char> *)&local_159);
      if (bVar2) {
        *(undefined4 *)aStr_local = 2;
      }
      else {
        GetJoinerType::anon_class_1_0_00000001::operator()(&local_1ba);
        local_58 = &local_1b8;
        local_60 = &local_1b9;
        bVar3 = ::fmt::v10::operator()(local_60);
        local_1b0 = (char *)bVar3.size_;
        local_1b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bVar3.data_
        ;
        ::fmt::v10::detail::
        check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                  ();
        local_68 = &local_1a8;
        local_78 = local_1b8;
        pcStack_70 = local_1b0;
        local_80 = local_d0;
        local_50 = &local_78;
        local_90 = local_1b8;
        local_88 = local_1b0;
        local_48 = local_90;
        pcStack_40 = local_88;
        error = (Error *)::fmt::v10::
                         make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const>
                                   ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)local_d0,(v10 *)local_68,local_1b8);
        local_30 = local_a0;
        local_38 = &error;
        local_20 = 0xd;
        args.field_1.values_ = in_R9.values_;
        args.desc_ = (unsigned_long_long)local_38;
        fmt.size_ = 0xd;
        fmt.data_ = local_88;
        local_28 = local_38;
        local_18 = local_30;
        local_10 = local_38;
        ::fmt::v10::vformat_abi_cxx11_(&local_1a8,(v10 *)local_90,fmt,args);
        Error::Error(&local_188,kInvalidArgs,&local_1a8);
        Error::operator=(__return_storage_ptr__,&local_188);
        Error::~Error(&local_188);
        std::__cxx11::string::~string((string *)&local_1a8);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Error Interpreter::GetJoinerType(JoinerType &aType, const std::string &aStr)
{
    Error error;

    if (CaseInsensitiveEqual(aStr, "meshcop"))
    {
        aType = JoinerType::kMeshCoP;
    }
    else if (CaseInsensitiveEqual(aStr, "ae"))
    {
        aType = JoinerType::kAE;
    }
    else if (CaseInsensitiveEqual(aStr, "nmkp"))
    {
        aType = JoinerType::kNMKP;
    }
    else
    {
        error = ERROR_INVALID_ARGS("{} is not a valid joiner type", aStr);
    }

    return error;
}